

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3x3.cpp
# Opt level: O2

void M3x3_Transpose(double (*m) [3])

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  
  pdVar2 = *m + 1;
  pdVar5 = m[1];
  for (lVar3 = 0; pdVar4 = pdVar5, lVar6 = -2, lVar3 != 2; lVar3 = lVar3 + 1) {
    for (; lVar3 + lVar6 != 0; lVar6 = lVar6 + 1) {
      dVar1 = pdVar2[lVar6 + 2];
      pdVar2[lVar6 + 2] = *pdVar4;
      *pdVar4 = dVar1;
      pdVar4 = pdVar4 + 3;
    }
    pdVar2 = pdVar2 + 4;
    pdVar5 = pdVar5 + 4;
  }
  return;
}

Assistant:

void M3x3_Transpose(double m[3][3])
{
   int i, j;
   double temp;

    for (i=0 ; i<2 ; i++)
    {
        for (j=i+1 ; j<3 ; j++)
        {
            temp   = m[i][j];
            m[i][j] = m[j][i];
            m[j][i] = temp;
        }
    }
}